

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::maybe_emit_array_assignment
          (CompilerMSL *this,uint32_t id_lhs,uint32_t id_rhs)

{
  Variant *pVVar1;
  ulong uVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  StorageClass SVar6;
  StorageClass SVar7;
  int iVar8;
  SPIRType *pSVar9;
  SPIRVariable *pSVar10;
  SPIRConstant *c;
  bool bVar11;
  uint local_78;
  uint local_74;
  string local_70;
  string local_50;
  
  uVar2 = (ulong)id_lhs;
  pSVar9 = Compiler::expression_type((Compiler *)this,id_lhs);
  pSVar9 = Compiler::get_pointee_type((Compiler *)this,pSVar9);
  bVar3 = Compiler::is_array((Compiler *)this,pSVar9);
  if (!bVar3) {
    return false;
  }
  if ((uVar2 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar2].type == TypeVariable)) {
    pSVar10 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar2);
  }
  else {
    pSVar10 = (SPIRVariable *)0x0;
  }
  if (((pSVar10 != (SPIRVariable *)0x0) && (pSVar10->remapped_variable == true)) &&
     (pSVar10->statically_assigned != false)) {
    return true;
  }
  if (((pSVar10 == (SPIRVariable *)0x0) ||
      ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
       [id_rhs].type != TypeConstant)) || (pSVar10->deferred_declaration != true)) {
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (((EVar4 != ExecutionModelTessellationControl) ||
        (bVar3 = Compiler::has_decoration((Compiler *)this,(ID)id_lhs,BuiltIn), !bVar3)) ||
       (uVar5 = Compiler::get_decoration((Compiler *)this,(ID)id_lhs,BuiltIn),
       uVar5 - 0xd < 0xfffffffe)) {
      SVar6 = CompilerGLSL::get_expression_effective_storage_class(&this->super_CompilerGLSL,id_lhs)
      ;
      SVar7 = CompilerGLSL::get_expression_effective_storage_class(&this->super_CompilerGLSL,id_rhs)
      ;
      iVar8 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x38])
                        (this,0,uVar2,(ulong)id_rhs,(ulong)SVar6,(ulong)SVar7);
      if ((char)iVar8 != '\0') {
        Compiler::register_write((Compiler *)this,id_lhs);
        return (bool)(char)iVar8;
      }
      return false;
    }
    bVar3 = Compiler::is_tessellating_triangles((Compiler *)this);
    bVar11 = uVar5 != 0xc;
    local_74 = (uint)bVar11 * 2 + 2;
    if (bVar3) {
      local_74 = (uint)bVar11 * 2 + 1;
    }
    if (bVar11 || !bVar3) {
      local_78 = 0;
      do {
        CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_lhs,true);
        CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,id_rhs,true);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[10],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                  (&this->super_CompilerGLSL,&local_50,(char (*) [2])0x391742,&local_78,
                   (char (*) [10])"] = half(",&local_70,(char (*) [2])0x391742,&local_78,
                   (char (*) [4])0x3902c2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        local_78 = local_78 + 1;
      } while (local_78 < local_74);
      return true;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_lhs,true);
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,id_rhs,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[6]>
              (&this->super_CompilerGLSL,&local_50,(char (*) [9])0x3a2218,&local_70,
               (char (*) [6])0x3902c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return true;
    }
  }
  else {
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_lhs,true);
    c = Variant::get<spirv_cross::SPIRConstant>
                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr + id_rhs);
    CompilerGLSL::constant_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,c,false,false);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_50,(char (*) [4])0x3a613c,&local_70,
               (char (*) [2])0x3a5fd0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return true;
    }
  }
  operator_delete(local_50._M_dataplus._M_p);
  return true;
}

Assistant:

bool CompilerMSL::maybe_emit_array_assignment(uint32_t id_lhs, uint32_t id_rhs)
{
	// We only care about assignments of an entire array
	auto &type = expression_type(id_lhs);
	if (!is_array(get_pointee_type(type)))
		return false;

	auto *var = maybe_get<SPIRVariable>(id_lhs);

	// Is this a remapped, static constant? Don't do anything.
	if (var && var->remapped_variable && var->statically_assigned)
		return true;

	if (ir.ids[id_rhs].get_type() == TypeConstant && var && var->deferred_declaration)
	{
		// Special case, if we end up declaring a variable when assigning the constant array,
		// we can avoid the copy by directly assigning the constant expression.
		// This is likely necessary to be able to use a variable as a true look-up table, as it is unlikely
		// the compiler will be able to optimize the spvArrayCopy() into a constant LUT.
		// After a variable has been declared, we can no longer assign constant arrays in MSL unfortunately.
		statement(to_expression(id_lhs), " = ", constant_expression(get<SPIRConstant>(id_rhs)), ";");
		return true;
	}

	if (is_tesc_shader() && has_decoration(id_lhs, DecorationBuiltIn))
	{
		auto builtin = BuiltIn(get_decoration(id_lhs, DecorationBuiltIn));
		// Need to manually unroll the array store.
		if (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter)
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin);
			if (array_size == 1)
				statement(to_expression(id_lhs), " = half(", to_expression(id_rhs), "[0]);");
			else
			{
				for (uint32_t i = 0; i < array_size; i++)
					statement(to_expression(id_lhs), "[", i, "] = half(", to_expression(id_rhs), "[", i, "]);");
			}
			return true;
		}
	}

	auto lhs_storage = get_expression_effective_storage_class(id_lhs);
	auto rhs_storage = get_expression_effective_storage_class(id_rhs);
	if (!emit_array_copy(nullptr, id_lhs, id_rhs, lhs_storage, rhs_storage))
		return false;

	register_write(id_lhs);

	return true;
}